

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::unpack_item(vm_val_t *val,CVmDataSource *src,CVmPackType *t,CVmPackGroup *group)

{
  CharConv *pCVar1;
  vm_obj_id_t vVar2;
  int iVar3;
  uint uVar4;
  int32_t intval;
  long lVar5;
  long lVar6;
  char *__s;
  size_t __n;
  unsigned_long uVar7;
  long in_RCX;
  ulong len;
  CVmPackType *in_RDX;
  long *in_RSI;
  vm_val_t *in_RDI;
  size_t i;
  unsigned_long lu;
  char buf [256];
  char *nul;
  CVmObjString *str;
  char pad;
  long l;
  int count;
  CharConv *cvtchar;
  CVmPackType *in_stack_fffffffffffffdf8;
  CVmPackType *in_stack_fffffffffffffe00;
  CVmDataSource *in_stack_fffffffffffffe08;
  CVmObjString *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  CVmDataSource *in_stack_fffffffffffffe20;
  vm_val_t *in_stack_fffffffffffffe28;
  CharConv *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  int local_1a8;
  ulong local_168;
  byte local_158 [4];
  int local_154;
  void *local_50;
  CVmObject *local_48;
  char local_39;
  long local_38;
  int local_2c;
  CharConv *local_28;
  long local_20;
  CVmPackType *local_18;
  long *local_10;
  vm_val_t *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = CharConv::conv_for_type(in_RDX);
  if (((local_28 == (CharConv *)0x0) || (local_18->null_term == 0)) || (0 < local_18->count)) {
    if (local_28 == (CharConv *)0x0) {
      switch(local_18->type_code) {
      case L'@':
        iVar3 = (**(code **)(*local_10 + 0x38))();
        if (local_18->bang == 0) {
          local_1a8 = (int)*(undefined8 *)(local_20 + 0x38);
        }
        else {
          lVar5 = CVmPackGroup::root_stream_ofs((CVmPackGroup *)in_stack_fffffffffffffe00);
          local_1a8 = (int)lVar5;
        }
        vm_val_t::set_int(local_8,iVar3 - local_1a8);
        break;
      case L'C':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vm_val_t::set_int(local_8,(uint)local_158[0]);
        break;
      case L'L':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        iVar3 = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
        uVar7 = ::osrp4(local_158);
        if ((local_18->tilde == 0) || (0x7fffffff < uVar7)) {
          vVar2 = CVmObjBigNum::createu
                            (iVar3,(ulong)in_stack_fffffffffffffe08,
                             (size_t)in_stack_fffffffffffffe00);
          vm_val_t::set_obj(local_8,vVar2);
        }
        else {
          vm_val_t::set_int(local_8,(int32_t)uVar7);
        }
        break;
      case L'Q':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        if (((local_18->tilde == 0) || (local_154 != 0)) || (((int)(char)local_158[3] & 0x80U) != 0)
           ) {
          vVar2 = CVmObjBigNum::create_rp8
                            ((int)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                             (char *)in_stack_fffffffffffffe08);
          vm_val_t::set_obj(local_8,vVar2);
        }
        else {
          lVar5 = ::osrp4s(local_158);
          vm_val_t::set_int(local_8,(int32_t)lVar5);
        }
        break;
      case L'S':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        uVar4 = ::osrp2(local_158);
        vm_val_t::set_int(local_8,uVar4 & 0xffff);
        break;
      case L'c':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vm_val_t::set_int(local_8,(int)(char)local_158[0]);
        break;
      case L'd':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vVar2 = CVmObjBigNum::create_from_ieee754
                          ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),in_stack_fffffffffffffe18
                           ,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
        vm_val_t::set_obj(local_8,vVar2);
        break;
      case L'f':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        vVar2 = CVmObjBigNum::create_from_ieee754
                          ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),in_stack_fffffffffffffe18
                           ,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
        vm_val_t::set_obj(local_8,vVar2);
        break;
      case L'k':
        local_168 = 0;
        local_28 = (CharConv *)0x0;
        while( true ) {
          if (0xff < local_168) {
            err_throw(0);
          }
          iVar3 = (**(code **)(*local_10 + 0x10))(local_10,local_158 + local_168,1);
          if (iVar3 != 0) {
            err_throw(0);
          }
          len = local_168 + 1;
          if (((int)(char)local_158[local_168] & 0x80U) == 0) break;
          local_158[local_168] = local_158[local_168] & 0x7f;
          local_168 = len;
        }
        if ((len < 5) || ((len == 5 && (((int)(char)local_158[0] & 0xf8U) == 0)))) {
          intval = decode_ber((char *)local_158,len);
          vm_val_t::set_int(local_8,intval);
        }
        else {
          vVar2 = CVmObjBigNum::create_from_ber
                            ((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                             in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          vm_val_t::set_obj(local_8,vVar2);
        }
        break;
      case L'l':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        lVar5 = ::osrp4s(local_158);
        vm_val_t::set_int(local_8,(int32_t)lVar5);
        break;
      case L'q':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        if ((local_18->tilde == 0) ||
           (((local_154 != 0 || (((int)(char)local_158[3] & 0x80U) != 0)) &&
            ((local_154 != -1 || (((int)(char)local_158[3] & 0x80U) == 0)))))) {
          vVar2 = CVmObjBigNum::create_rp8s
                            ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                             in_stack_fffffffffffffe18);
          vm_val_t::set_obj(local_8,vVar2);
        }
        else {
          lVar5 = ::osrp4s(local_158);
          vm_val_t::set_int(local_8,(int32_t)lVar5);
        }
        break;
      case L's':
        read_num_bytes((char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                       (size_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        iVar3 = osrp2s(local_158);
        vm_val_t::set_int(local_8,iVar3);
      }
    }
    else {
      local_2c = CVmPackType::get_count(in_stack_fffffffffffffe00);
      iVar3 = (int)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      if (local_18->count_in_bytes != 0) {
        local_2c = (**(code **)(*(long *)local_28 + 0x20))(local_28,(long)local_2c);
      }
      pCVar1 = local_28;
      if (local_2c == 0) {
        vVar2 = CVmObjString::create(iVar3,(size_t)in_stack_fffffffffffffdf8);
        vm_val_t::set_obj(local_8,vVar2);
      }
      else {
        if ((local_18->count == -2) || (local_18->up_to_count != 0)) {
          lVar5 = (**(code **)(*local_10 + 0x30))();
          lVar6 = (**(code **)(*local_10 + 0x38))();
          local_38 = (**(code **)(*(long *)pCVar1 + 0x20))(pCVar1,lVar5 - lVar6);
          iVar3 = (int)local_38;
          if (local_18->count == -2) {
            local_2c = iVar3;
            if (0x7fffffff < local_38) {
              err_throw(0);
            }
          }
          else if (local_38 < local_2c) {
            local_2c = iVar3;
          }
        }
        local_39 = get_padding_char(L'\0');
        (**(code **)(*(long *)local_28 + 0x30))(local_28,local_8,local_10,local_2c,(int)local_39);
        if (((local_18->null_term != 0) &&
            ((**(code **)(*(long *)local_28 + 0x38))(), local_8->typ == VM_OBJ)) &&
           (iVar3 = CVmObjString::is_string_obj(0), iVar3 != 0)) {
          local_48 = vm_objp(0);
          __s = CVmObjString::cons_get_buf((CVmObjString *)local_48);
          __n = CVmObjString::cons_get_len((CVmObjString *)0x37d5cf);
          local_50 = memchr(__s,0,__n);
          if (local_50 != (void *)0x0) {
            CVmObjString::cons_shrink_buffer
                      (in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
          }
        }
      }
    }
  }
  else {
    CharConv::unpackz(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20)
    ;
  }
  return;
}

Assistant:

void CVmPack::unpack_item(VMG_ vm_val_t *val,
                          CVmDataSource *src, const CVmPackType *t,
                          const CVmPackGroup *group)
{
    /* check for a character conversion */
    CharConv *cvtchar = CharConv::conv_for_type(t);
    if (cvtchar != 0 && t->null_term && t->count <= 0)
    {
        /* 
         *   It's a null-terminated string type without a fixed field width.
         *   Use the special unpacking method for this type.  
         */
        cvtchar->unpackz(vmg_ val, src);

        /* done */
        return;
    }
    if (cvtchar != 0)
    {
        /* character string - the repeat count is the length */
        int count = t->get_count();

        /* if the count is in bytes, convert it */
        if (t->count_in_bytes)
            count = cvtchar->bytes_to_count(count);

        /* if the character count is zero, return an empty string */
        if (count == 0)
        {
            val->set_obj(CVmObjString::create(vmg_ FALSE, 0));
            return;
        }

        /* if it's '*', we read the rest of the data source */
        if (t->count == ITER_STAR || t->up_to_count)
        {
            /* 
             *   get the remaining length, and convert it to a repeat count
             *   appropriate to the string conversion type 
             */
            long l = cvtchar->bytes_to_count(src->get_size() - src->get_pos());

            /* use 'l' as a maximum for 'n*', or the actual count for '*' */
            if (t->count == ITER_STAR)
            {
                /* 
                 *   '*' means read the whole rest of the file - that's a
                 *   long value, so cast it to int, making sure we don't
                 *   overflow 
                 */
                count = (int)l;
                if (l > INT_MAX)
                    err_throw(VMERR_NUM_OVERFLOW);
            }
            else
            {
                /* 
                 *   'n*' means read up to n, stopping at EOF, so stop at 'l'
                 *   if it's less than the specified count 
                 */
                if (l < count)
                    count = (int)l;
            }
        }

        /* figure the padding type */
        char pad = get_padding_char(t->type_code);

        /* unpack the string */
        cvtchar->unpack(vmg_ val, src, count, pad);

        /* check for null termination */
        if (t->null_term)
        {
            /* skip the null, which is tacked on after the fixed length */
            cvtchar->readch(src);

            /* terminate the string at the first null, if present */
            if (val->typ == VM_OBJ
                && CVmObjString::is_string_obj(vmg_ val->val.obj))
            {
                /* get the string */
                CVmObjString *str = (CVmObjString *)vm_objp(vmg_ val->val.obj);

                /* scan for a null byte */
                char *nul = (char *)memchr(
                    str->cons_get_buf(), 0, str->cons_get_len());

                /* if we found a null byte, terminate the string there */
                if (nul != 0)
                    str->cons_shrink_buffer(vmg_ nul);
            }
        }

        /* done */
        return;
    }

    /* it's not a string; check the numeric types */
    char buf[256];
    switch (t->type_code)
    {
    case '@':
        /* 
         *   @? retrieves the current position, relative to the current group
         *   or, if ! is specified, relative to the start of the string
         */
        val->set_int(src->get_pos() -
                     (t->bang ? group->root_stream_ofs() : group->stream_ofs));
        break;
        
    case 'c':
        /* signed byte */
        read_num_bytes(buf, src, 1, t);
        val->set_int((char)buf[0]);
        break;

    case 'C':
        /* unsigned byte */
        read_num_bytes(buf, src, 1, t);
        val->set_int((unsigned char)buf[0]);
        break;

    case 's':
        /* signed 16-bit short */
        read_num_bytes(buf, src, 2, t);
        val->set_int(osrp2s(buf));
        break;
        
    case 'S':
        /* unsigned 16-bit short */
        read_num_bytes(buf, src, 2, t);
        val->set_int((unsigned short)osrp2(buf));
        break;
        
    case 'l':
        /* signed 32-bit long */
        read_num_bytes(buf, src, 4, t);
        val->set_int(osrp4s(buf));
        break;
        
    case 'L':
        /*
         *   Unsigned 32-bit long.  The VM_INT type is a signed long, so we
         *   can't use this to represent the full range of unsigned longs.
         *   Instead, use BigNumber.  Note that we could check the file value
         *   and use VM_INT if the value actually fits (i.e., it's less than
         *   0x7fffffff); this might be desirable in some cases because
         *   VM_INT is much more efficient than BigNumber.  However, since
         *   the caller is asking for type 'L', they're clearly expecting the
         *   full unsigned 32-bit range, which might mean they plan to do
         *   further arithmetic on the value we read, in which case they'd
         *   expect this arithmetic to be safe on unsigned 32-bit values.
         *   The only way we can guarantee this is to use a BigNumber for the
         *   value regardless of whether or not it fits in a VM_INT.
         *   
         *   If the ~ qualifier is set, unpack into an int if the value fits
         *   in a signed 32-bit int.  
         */
        {
            read_num_bytes(buf, src, 4, t);
            unsigned long lu = osrp4(buf);
            if (t->tilde && lu <= 0x7fffffff)
                val->set_int((long)lu);
            else
                val->set_obj(CVmObjBigNum::createu(vmg_ FALSE, lu, 10));
        }
        break;

    case 'q':
        /* 
         *   "Long long" 64-bit integer, signed.  There's no VM_xxx primitive
         *   type that can handle a value this large, so use BigNumber.  Read
         *   the 8-byte file value.
         *   
         *   If the ~ qualifier is set, and the high part of the value is all
         *   zeros or all '1' bits, return it as an integer.  Note that the
         *   buffer is in our standard osrp8 format, which is little-endian
         *   2's complement, so we can inspect the byte values portably.  
         */
        read_num_bytes(buf, src, 8, t);
        if (t->tilde
            && ((memcmp(buf+4, "\0\0\0\0", 4) == 0
                 && (buf[3] & 0x80) == 0)
                || (memcmp(buf+4, "\377\377\377\377", 4) == 0
                    && (buf[3] & 0x80) != 0)))
            val->set_int(osrp4s(buf));
        else
            val->set_obj(CVmObjBigNum::create_rp8s(vmg_ FALSE, buf));
        break;

    case 'Q':
        /* 
         *   "Long long" 64-bit integer, unsigned.  Unpack as a BigNumber,
         *   unless the ~ qualifier is set and the value will fit in an int.
         */
        read_num_bytes(buf, src, 8, t);
        if (t->tilde
            && memcmp(buf+4, "\0\0\0\0", 4) == 0
            && (buf[3] & 0x80) == 0)
            val->set_int(osrp4s(buf));
        else
            val->set_obj(CVmObjBigNum::create_rp8(vmg_ FALSE, buf));
        break;

    case 'k':
        /* 
         *   BER compressed unsigned integer.  This is a sequence of 7-bit,
         *   base-128 "digits", most significant digit first.  The high bit
         *   (0x80) is set on each digit except the last, which tells us
         *   where the value ends.  Read bytes one at a time until we reach
         *   the last byte or run out of buffer space.  
         */
        {
            size_t i;
            for (i = 0 ; ; )
            {
                /* if we're out of buffer space, throw an error */
                if (i >= sizeof(buf))
                    err_throw(VMERR_NUM_OVERFLOW);

                /* read the next byte */
                if (src->read(buf + i, 1))
                    err_throw(VMERR_READ_FILE);

                /* if the high bit isn't set, this is the last byte */
                if ((buf[i++] & 0x80) == 0)
                    break;

                /* keep just the low-order 7 bits of the value */
                buf[i-1] &= 0x7F;
            }

            /* 
             *   If the value is 31 bits or fewer, return it as an integer.
             *   Otherwise, return it as a BigNumber.  31 bits fits in 4
             *   bytes (7*4=28) plus 3 bits of the MSB, so if we have more
             *   than 5 bytes, or any of bits 4-8 of the MSB are set, we need
             *   a BigNumber.  (Why 31 bits and not 32?  Because BER values
             *   are unsigned, and our int32 type is signed, meaning it only
             *   holds 31 bits for a positive value.)  
             */
            if (i < 5 || (i == 5 && (buf[0] & 0xF8) == 0))
            {
                /* it fits in a 32-bit integer - decode it */
                val->set_int(decode_ber(buf, i));
            }
            else
            {
                /* more than 31 bits - decode into a BigNumber */
                val->set_obj(CVmObjBigNum::create_from_ber(vmg_ FALSE, buf, i));
            }
        }
        break;
        
    case 'f':
        /* 
         *   Float - read the 32-bit float value, and return it as a
         *   BigNumber value.  Our standard IEEE 754-2008 32-bit format
         *   represents 7.22 decimal digits of precision, so keep 8 digits.  
         */
        read_num_bytes(buf, src, 4, t);
        val->set_obj(CVmObjBigNum::create_from_ieee754(vmg_ FALSE, buf, 32));
        break;
        
    case 'd':
        /* 
         *   Double - read the 64-bit double value, and return it as a
         *   BigNumber value.  Our standard IEEE 754-2008 64-bit format
         *   represents 15.95 decimal digits of precision.  
         */
        read_num_bytes(buf, src, 8, t);
        val->set_obj(CVmObjBigNum::create_from_ieee754(vmg_ FALSE, buf, 64));
        break;
    }
}